

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

int __thiscall CEditor::GetLineDistance(CEditor *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->m_ZoomLevel;
  iVar2 = 0x10;
  if ((((100 < iVar1) && (iVar2 = 0x20, 0xfa < iVar1)) && (iVar2 = 0x40, 0x1c2 < iVar1)) &&
     (iVar2 = 0x80, 0x352 < iVar1)) {
    iVar2 = (uint)(0x60e < iVar1) * 0x100 + 0x100;
  }
  return iVar2;
}

Assistant:

int CEditor::GetLineDistance() const
{
	int LineDistance = 512;

	if(m_ZoomLevel <= 100)
		LineDistance = 16;
	else if(m_ZoomLevel <= 250)
		LineDistance = 32;
	else if(m_ZoomLevel <= 450)
		LineDistance = 64;
	else if(m_ZoomLevel <= 850)
		LineDistance = 128;
	else if(m_ZoomLevel <= 1550)
		LineDistance = 256;

	return LineDistance;
}